

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * google::protobuf::io::CodedInputStream::ReadLittleEndian32FromArray
                  (uint8 *buffer,uint32 *value)

{
  uint32 *value_local;
  uint8 *buffer_local;
  
  *value = *(uint32 *)buffer;
  return buffer + 4;
}

Assistant:

inline const uint8* CodedInputStream::ReadLittleEndian32FromArray(
    const uint8* buffer, uint32* value) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  memcpy(value, buffer, sizeof(*value));
  return buffer + sizeof(*value);
#else
  *value = (static_cast<uint32>(buffer[0])) |
           (static_cast<uint32>(buffer[1]) << 8) |
           (static_cast<uint32>(buffer[2]) << 16) |
           (static_cast<uint32>(buffer[3]) << 24);
  return buffer + sizeof(*value);
#endif
}